

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall cs::instance_type::compile(instance_type *this,string *path)

{
  byte bVar1;
  element_type *peVar2;
  fatal_error *this_00;
  string *in_RSI;
  ifstream in;
  string *in_stack_fffffffffffffd88;
  undefined6 in_stack_fffffffffffffdb0;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  undefined1 local_218 [112];
  istream *in_stack_fffffffffffffe58;
  instance_type *in_stack_fffffffffffffe60;
  
  peVar2 = std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4f61ed);
  std::__cxx11::string::operator=((string *)&peVar2->file_path,in_RSI);
  std::ifstream::ifstream(local_218,in_RSI,_S_bin);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar3 = 1;
    this_00 = (fatal_error *)__cxa_allocate_exception(0x28);
    std::operator+(in_stack_fffffffffffffdb8,
                   (char *)CONCAT17(uVar3,CONCAT16(bVar1,in_stack_fffffffffffffdb0)));
    fatal_error::fatal_error(this_00,in_stack_fffffffffffffd88);
    __cxa_throw(this_00,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  compile(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void instance_type::compile(const std::string &path)
	{
		// Read from file
		context->file_path = path;
		std::ifstream in(path, std::ios::binary);
		if (!in.is_open())
			throw fatal_error(path + ": No such file or directory");
		compile(in);
	}